

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack19(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar2 = (uint)*in & 0x7ffff;
  *out = uVar2;
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x13 | uVar2;
  out[1] = (uint)uVar1 >> 0xd & 0x3f;
  Unroller<(unsigned_short)19,_(unsigned_short)2>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack19(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<19>::Pack(in, out);
}